

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

bool peparse::getRelocations(parsed_pe *p)

{
  uint16_t uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  VA v;
  uint16_t entry;
  uint32_t pageRva;
  uint32_t blockSize;
  reloc r;
  section d;
  ushort local_a6;
  uint32_t local_a4;
  uint local_a0;
  uint32_t local_9c;
  value_type local_98;
  section local_88;
  
  uVar1 = (p->peHeader).nt.OptionalMagic;
  if (uVar1 == 0x10b) {
    lVar4 = 0x124;
    lVar3 = 0x120;
  }
  else {
    if (uVar1 != 0x20b) {
      return false;
    }
    lVar4 = 0x214;
    lVar3 = 0x210;
  }
  uVar5 = *(uint *)((long)(p->peHeader).dos.e_res + lVar4 + -0x2c);
  if (uVar5 == 0) {
    return true;
  }
  uVar6 = *(uint *)((long)(p->peHeader).dos.e_res + lVar3 + -0x2c);
  local_88.sectionName._M_dataplus._M_p = (pointer)&local_88.sectionName.field_2;
  local_88.sectionName._M_string_length = 0;
  local_88.sectionName.field_2._M_local_buf[0] = '\0';
  if (uVar1 == 0x20b) {
    v = (ulong)uVar6 + (p->peHeader).nt.OptionalHeader64.ImageBase;
  }
  else {
    if (uVar1 != 0x10b) goto LAB_001163b3;
    v = (VA)(uVar6 + (p->peHeader).nt.OptionalHeader.ImageBase);
  }
  bVar2 = getSecForVA(&p->internal->secs,v,&local_88);
  if (bVar2) {
    uVar6 = (int)v - (int)local_88.sectionBase;
    local_a0 = uVar5;
    while( true ) {
      if (local_a0 <= uVar6) {
        std::__cxx11::string::~string((string *)&local_88);
        return true;
      }
      bVar2 = readDword(local_88.sectionData,uVar6,&local_a4);
      if ((!bVar2) || (bVar2 = readDword(local_88.sectionData,uVar6 + 4,&local_9c), !bVar2)) break;
      uVar5 = local_9c - 8 >> 1;
      uVar6 = uVar6 + 8;
      while (bVar2 = uVar5 != 0, uVar5 = uVar5 - 1, bVar2) {
        bVar2 = readWord(local_88.sectionData,uVar6,&local_a6);
        if (!bVar2) goto LAB_001163b3;
        uVar1 = (p->peHeader).nt.OptionalMagic;
        if (uVar1 == 0x20b) {
          local_98.shiftedAddr =
               (ulong)((local_a6 & 0xfff) + local_a4) + (p->peHeader).nt.OptionalHeader64.ImageBase;
        }
        else {
          if (uVar1 != 0x10b) goto LAB_001163b3;
          local_98.shiftedAddr =
               (VA)((local_a6 & 0xfff) + local_a4 + (p->peHeader).nt.OptionalHeader.ImageBase);
        }
        local_98.type = (reloc_type)(local_a6 >> 0xc);
        std::vector<peparse::reloc,_std::allocator<peparse::reloc>_>::push_back
                  (&p->internal->relocs,&local_98);
        uVar6 = uVar6 + 2;
      }
    }
  }
LAB_001163b3:
  std::__cxx11::string::~string((string *)&local_88);
  return false;
}

Assistant:

bool getRelocations(parsed_pe *p) {
  data_directory relocDir;
  if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
    relocDir = p->peHeader.nt.OptionalHeader.DataDirectory[DIR_BASERELOC];
  } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
    relocDir = p->peHeader.nt.OptionalHeader64.DataDirectory[DIR_BASERELOC];
  } else {
    return false;
  }

  if (relocDir.Size != 0) {
    section d;
    VA vaAddr;
    if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
      vaAddr =
          relocDir.VirtualAddress + p->peHeader.nt.OptionalHeader.ImageBase;
    } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
      vaAddr =
          relocDir.VirtualAddress + p->peHeader.nt.OptionalHeader64.ImageBase;
    } else {
      return false;
    }

    if (!getSecForVA(p->internal->secs, vaAddr, d)) {
      return false;
    }

    auto rvaofft = static_cast<std::uint32_t>(vaAddr - d.sectionBase);

    while (rvaofft < relocDir.Size) {
      std::uint32_t pageRva;
      std::uint32_t blockSize;

      if (!readDword(d.sectionData,
                     rvaofft + offsetof(reloc_block, PageRVA),
                     pageRva)) {
        return false;
      }

      if (!readDword(d.sectionData,
                     rvaofft + offsetof(reloc_block, BlockSize),
                     blockSize)) {
        return false;
      }

      // BlockSize - The total number of bytes in the base relocation block,
      // including the Page RVA and Block Size fields and the Type/Offset fields
      // that follow. Therefore we should subtract 8 bytes from BlockSize to
      // exclude the Page RVA and Block Size fields.
      std::uint32_t entryCount = (blockSize - 8) / sizeof(std::uint16_t);

      // Skip the Page RVA and Block Size fields
      rvaofft += sizeof(reloc_block);

      // Iterate over all of the block Type/Offset entries
      while (entryCount != 0) {
        std::uint16_t entry;
        std::uint8_t type;
        std::uint16_t offset;

        if (!readWord(d.sectionData, rvaofft, entry)) {
          return false;
        }

        // Mask out the type and assign
        type = entry >> 12;
        // Mask out the offset and assign
        offset = entry & static_cast<std::uint16_t>(~0xf000);

        // Produce the VA of the relocation
        VA relocVA;
        if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_32_MAGIC) {
          relocVA = pageRva + offset + p->peHeader.nt.OptionalHeader.ImageBase;
        } else if (p->peHeader.nt.OptionalMagic == NT_OPTIONAL_64_MAGIC) {
          relocVA =
              pageRva + offset + p->peHeader.nt.OptionalHeader64.ImageBase;
        } else {
          return false;
        }

        // Store in our list
        reloc r;

        r.shiftedAddr = relocVA;
        r.type = static_cast<reloc_type>(type);
        p->internal->relocs.push_back(r);

        entryCount--;
        rvaofft += sizeof(std::uint16_t);
      }
    }
  }

  return true;
}